

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugEventObject.cpp
# Opt level: O1

void __thiscall
JsrtDebugDocumentManager::ClearDebugDocument
          (JsrtDebugDocumentManager *this,ScriptContext *scriptContext)

{
  uint uVar1;
  RecyclerWeakReference<Js::Utf8SourceInfo> *pRVar2;
  Utf8SourceInfo *this_00;
  BaseDictionary<unsigned_int,_Js::DebugDocument_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_01;
  Type pSVar3;
  DebugDocument *pDVar4;
  List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
  *pLVar5;
  DebugDocument *this_02;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  
  if ((scriptContext != (ScriptContext *)0x0) &&
     (pLVar5 = Memory::
               RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>_>
               ::operator->(&scriptContext->sourceList),
     0 < (pLVar5->
         super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
         ).count)) {
    lVar7 = 0;
    do {
      pRVar2 = (pLVar5->
               super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
               ).buffer.ptr[lVar7].ptr;
      if (((((ulong)pRVar2 & 1) == 0 && pRVar2 != (RecyclerWeakReference<Js::Utf8SourceInfo> *)0x0)
          && (this_00 = (Utf8SourceInfo *)(pRVar2->super_RecyclerWeakReferenceBase).strongRef,
             this_00 != (Utf8SourceInfo *)0x0)) &&
         ((this_00->m_debugDocument).ptr != (DebugDocument *)0x0)) {
        this_02 = Js::Utf8SourceInfo::GetDebugDocument(this_00);
        this_01 = this->breakpointDebugDocumentDictionary;
        if ((this_01 !=
             (BaseDictionary<unsigned_int,_Js::DebugDocument_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              *)0x0) && (this_01->bucketCount != 0)) {
          uVar6 = 0;
          do {
            if (this_01->buckets[uVar6] != 0xffffffff) {
              uVar9 = 0xffffffff;
              uVar8 = this_01->buckets[uVar6];
              do {
                pSVar3 = this_01->entries;
                pDVar4 = pSVar3[(int)uVar8].
                         super_DefaultHashedEntry<unsigned_int,_Js::DebugDocument_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                         .super_KeyValueEntry<unsigned_int,_Js::DebugDocument_*>.
                         super_ValueEntry<Js::DebugDocument_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Js::DebugDocument_*>_>
                         .super_KeyValueEntryDataLayout2<unsigned_int,_Js::DebugDocument_*>.value;
                uVar1 = pSVar3[(int)uVar8].
                        super_DefaultHashedEntry<unsigned_int,_Js::DebugDocument_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                        .super_KeyValueEntry<unsigned_int,_Js::DebugDocument_*>.
                        super_ValueEntry<Js::DebugDocument_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Js::DebugDocument_*>_>
                        .super_KeyValueEntryDataLayout2<unsigned_int,_Js::DebugDocument_*>.next;
                if ((pDVar4 != (DebugDocument *)0x0) && (this_02 == pDVar4)) {
                  if ((int)uVar9 < 0) {
                    this_01->buckets[uVar6] = uVar1;
                  }
                  else {
                    pSVar3[uVar9].
                    super_DefaultHashedEntry<unsigned_int,_Js::DebugDocument_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                    .super_KeyValueEntry<unsigned_int,_Js::DebugDocument_*>.
                    super_ValueEntry<Js::DebugDocument_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Js::DebugDocument_*>_>
                    .super_KeyValueEntryDataLayout2<unsigned_int,_Js::DebugDocument_*>.next = uVar1;
                  }
                  pSVar3[(int)uVar8].
                  super_DefaultHashedEntry<unsigned_int,_Js::DebugDocument_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                  .super_KeyValueEntry<unsigned_int,_Js::DebugDocument_*>.
                  super_ValueEntry<Js::DebugDocument_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Js::DebugDocument_*>_>
                  .super_KeyValueEntryDataLayout2<unsigned_int,_Js::DebugDocument_*>.value =
                       (DebugDocument *)0x0;
                  pSVar3[(int)uVar8].
                  super_DefaultHashedEntry<unsigned_int,_Js::DebugDocument_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                  .super_KeyValueEntry<unsigned_int,_Js::DebugDocument_*>.
                  super_ValueEntry<Js::DebugDocument_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Js::DebugDocument_*>_>
                  .super_KeyValueEntryDataLayout2<unsigned_int,_Js::DebugDocument_*>.key = 0;
                  JsUtil::
                  BaseDictionary<unsigned_int,_Js::DebugDocument_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  ::SetNextFreeEntryIndex
                            (this_01,this_01->entries + (int)uVar8,
                             -(uint)(this_01->freeCount == 0) | this_01->freeList);
                  this_01->freeList = uVar8;
                  this_01->freeCount = this_01->freeCount + 1;
                  uVar8 = uVar9;
                  if (this_01->stats != (DictionaryStats *)0x0) {
                    DictionaryStats::Remove(this_01->stats,this_01->buckets[uVar6] == -1);
                  }
                }
                uVar9 = uVar8;
                uVar8 = uVar1;
              } while (uVar1 != 0xffffffff);
            }
            uVar6 = uVar6 + 1;
          } while (uVar6 < this_01->bucketCount);
        }
        Js::Utf8SourceInfo::ClearDebugDocument(this_02->utf8SourceInfo,true);
        Js::DebugDocument::~DebugDocument(this_02);
        Memory::HeapAllocator::Free(&Memory::HeapAllocator::Instance,this_02,0x20);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < (pLVar5->
                     super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                     ).count);
  }
  return;
}

Assistant:

void JsrtDebugDocumentManager::ClearDebugDocument(Js::ScriptContext * scriptContext)
{
    if (scriptContext != nullptr)
    {
        scriptContext->MapScript([&](Js::Utf8SourceInfo* sourceInfo)
        {
            if (sourceInfo->HasDebugDocument())
            {
                Js::DebugDocument* debugDocument = sourceInfo->GetDebugDocument();

                // Remove the debugdocument from breakpoint dictionary
                if (this->breakpointDebugDocumentDictionary != nullptr)
                {
                    this->breakpointDebugDocumentDictionary->MapAndRemoveIf([&](JsUtil::SimpleDictionaryEntry<UINT, Js::DebugDocument *> keyValue)
                    {
                        if (keyValue.Value() != nullptr && keyValue.Value() == debugDocument)
                        {
                            return true;
                        }
                        return false;
                    });
                }

                debugDocument->GetUtf8SourceInfo()->ClearDebugDocument();
                HeapDelete(debugDocument);
                debugDocument = nullptr;
            }
        });
    }
}